

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

VP8LMultipliers
GetBestColorTransformForTile
          (int tile_x,int tile_y,int bits,VP8LMultipliers prev_x,VP8LMultipliers prev_y,int quality,
          int xsize,int ysize,uint32_t *accumulated_red_histo,uint32_t *accumulated_blue_histo,
          uint32_t *argb)

{
  VP8LMultipliers prev_y_00;
  int iVar1;
  int stride;
  int tile_width_00;
  int tile_height_00;
  undefined2 in_CX;
  undefined4 in_EDX;
  uint32_t *unaff_RBX;
  int in_ESI;
  int in_EDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  VP8LMultipliers in_stack_0000001a;
  VP8LMultipliers in_stack_0000001d;
  uint32_t *tile_argb;
  int tile_height;
  int tile_width;
  int all_y_max;
  int all_x_max;
  int tile_x_offset;
  int tile_y_offset;
  int max_tile_size;
  VP8LMultipliers best_tx;
  VP8LMultipliers local_5c [13];
  byte local_20;
  undefined2 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  VP8LMultipliers local_b;
  
  uVar4 = (undefined1)((uint)in_R8D >> 0x10);
  uVar3 = (undefined1)((uint)in_R8D >> 8);
  local_20 = (byte)in_EDX;
  uVar2 = (undefined2)((uint)in_EDX >> 0x10);
  iVar1 = 1 << (local_20 & 0x1f);
  stride = in_ESI * iVar1;
  tile_width_00 = in_EDI * iVar1;
  tile_height_00 = GetMin(tile_width_00 + iVar1,in_stack_00000008);
  GetMin(stride + iVar1,in_stack_00000010);
  MultipliersClear(&local_b);
  prev_y_00.red_to_blue = (uint8_t)in_ESI;
  prev_y_00.green_to_red = (char)uVar2;
  prev_y_00.green_to_blue = (char)((ushort)uVar2 >> 8);
  GetBestGreenToRed((uint32_t *)CONCAT44(in_R9D,iVar1),stride,tile_width_00,tile_height_00,
                    SUB43((uint)in_ESI >> 8,0),prev_y_00,CONCAT22(in_CX,CONCAT11(uVar4,uVar3)),
                    unaff_RBX,(VP8LMultipliers *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  GetBestGreenRedToBlue
            ((uint32_t *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_0000000c,
             in_stack_00000008,unaff_retaddr_00,in_stack_0000001d,in_stack_0000001a,(int)tile_argb,
             _tile_height,_all_y_max);
  local_5c[0].red_to_blue = local_b.red_to_blue;
  local_5c[0].green_to_red = local_b.green_to_red;
  local_5c[0].green_to_blue = local_b.green_to_blue;
  return local_5c[0];
}

Assistant:

static VP8LMultipliers GetBestColorTransformForTile(
    int tile_x, int tile_y, int bits, VP8LMultipliers prev_x,
    VP8LMultipliers prev_y, int quality, int xsize, int ysize,
    const uint32_t accumulated_red_histo[256],
    const uint32_t accumulated_blue_histo[256], const uint32_t* const argb) {
  const int max_tile_size = 1 << bits;
  const int tile_y_offset = tile_y * max_tile_size;
  const int tile_x_offset = tile_x * max_tile_size;
  const int all_x_max = GetMin(tile_x_offset + max_tile_size, xsize);
  const int all_y_max = GetMin(tile_y_offset + max_tile_size, ysize);
  const int tile_width = all_x_max - tile_x_offset;
  const int tile_height = all_y_max - tile_y_offset;
  const uint32_t* const tile_argb = argb + tile_y_offset * xsize
                                  + tile_x_offset;
  VP8LMultipliers best_tx;
  MultipliersClear(&best_tx);

  GetBestGreenToRed(tile_argb, xsize, tile_width, tile_height,
                    prev_x, prev_y, quality, accumulated_red_histo, &best_tx);
  GetBestGreenRedToBlue(tile_argb, xsize, tile_width, tile_height,
                        prev_x, prev_y, quality, accumulated_blue_histo,
                        &best_tx);
  return best_tx;
}